

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

fnet_socket_t fnet_socket_accept(fnet_socket_t sock,fnet_address_t *addr)

{
  sockaddr *in_RSI;
  int in_EDI;
  int client_sock;
  socklen_t addr_len;
  socklen_t *local_30;
  socklen_t local_14 [4];
  fnet_socket_t local_4;
  
  local_14[0] = 0x80;
  if (in_RSI == (sockaddr *)0x0) {
    local_30 = (socklen_t *)0x0;
  }
  else {
    local_30 = local_14;
  }
  local_4 = accept(in_EDI,in_RSI,local_30);
  if (local_4 == 0xffffffff) {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

fnet_socket_t fnet_socket_accept(fnet_socket_t sock, fnet_address_t *addr)
{
    socklen_t addr_len = sizeof(fnet_address_t);
    int client_sock = accept((int)sock, (struct sockaddr *)addr, addr ? &addr_len : 0);
    if (client_sock == -1)
        return FNET_INVALID_SOCKET;
    return (fnet_socket_t)client_sock;
}